

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall
Assimp::Collada::Animation::CollectChannelsRecursively
          (Animation *this,
          vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          *channels)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  reference ppAVar2;
  Animation *pAnim;
  __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_48;
  iterator it;
  __normal_iterator<Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
  local_28;
  const_iterator local_20;
  vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  *local_18;
  vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  *channels_local;
  Animation *this_local;
  
  local_18 = channels;
  channels_local =
       (vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        *)this;
  local_28._M_current =
       (AnimationChannel *)
       std::
       vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
       ::end(channels);
  __gnu_cxx::
  __normal_iterator<Assimp::Collada::AnimationChannel_const*,std::vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>>
  ::__normal_iterator<Assimp::Collada::AnimationChannel*>
            ((__normal_iterator<Assimp::Collada::AnimationChannel_const*,std::vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>>
              *)&local_20,&local_28);
  __first = std::
            vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
            ::begin(&this->mChannels);
  __last = std::
           vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
           ::end(&this->mChannels);
  it._M_current =
       (Animation **)
       std::
       vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>::
       insert<__gnu_cxx::__normal_iterator<Assimp::Collada::AnimationChannel*,std::vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>>,void>
                 ((vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>
                   *)channels,local_20,
                  (__normal_iterator<Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                   )__first._M_current,
                  (__normal_iterator<Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                   )__last._M_current);
  local_48._M_current =
       (Animation **)
       std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
       begin(&this->mSubAnims);
  while( true ) {
    pAnim = (Animation *)
            std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ::end(&this->mSubAnims);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
                        *)&pAnim);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
              ::operator*(&local_48);
    CollectChannelsRecursively(*ppAVar2,local_18);
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void CollectChannelsRecursively(std::vector<AnimationChannel> &channels)
	{
		channels.insert(channels.end(), mChannels.begin(), mChannels.end());

		for (std::vector<Animation*>::iterator it = mSubAnims.begin(); it != mSubAnims.end(); ++it)
		{
			Animation *pAnim = (*it);

			pAnim->CollectChannelsRecursively(channels);
		}
	}